

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O3

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_remIleavedBits_naive_matches_templated_::
~Test_bitileave_remIleavedBits_naive_matches_templated_
          (Test_bitileave_remIleavedBits_naive_matches_templated_ *this)

{
  Test::~Test(&this->super_Test);
  operator_delete(this,0x18);
  return;
}

Assistant:

BITMANIP_TEST(bitileave, remIleavedBits_naive_matches_templated)
{
    constexpr size_t iterations = 1024 * 8;

    std::mt19937 rng{12345};
    std::uniform_int_distribution<std::uint64_t> distr{0, std::numeric_limits<std::uint64_t>::max()};

    for (size_t i = 0; i < iterations; ++i) {
        const auto input = distr(rng);
        BITMANIP_ASSERT_EQ(remIleavedBits_const<1>(input), detail::remIleavedBits_naive(input, 1));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<2>(input), detail::remIleavedBits_naive(input, 2));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<3>(input), detail::remIleavedBits_naive(input, 3));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<4>(input), detail::remIleavedBits_naive(input, 4));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<5>(input), detail::remIleavedBits_naive(input, 5));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<6>(input), detail::remIleavedBits_naive(input, 6));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<7>(input), detail::remIleavedBits_naive(input, 7));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<8>(input), detail::remIleavedBits_naive(input, 8));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<9>(input), detail::remIleavedBits_naive(input, 9));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<10>(input), detail::remIleavedBits_naive(input, 10));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<11>(input), detail::remIleavedBits_naive(input, 11));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<12>(input), detail::remIleavedBits_naive(input, 12));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<13>(input), detail::remIleavedBits_naive(input, 13));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<14>(input), detail::remIleavedBits_naive(input, 14));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<15>(input), detail::remIleavedBits_naive(input, 15));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<16>(input), detail::remIleavedBits_naive(input, 16));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<32>(input), detail::remIleavedBits_naive(input, 32));
        BITMANIP_ASSERT_EQ(remIleavedBits_const<63>(input), detail::remIleavedBits_naive(input, 63));
    }
}